

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O2

int CompareFontTables(TestCase *ptcase,GrcRtFileFont *pfontBmark,GrcRtFileFont *pfontTest)

{
  bool bVar1;
  bool bVar2;
  fontTableId32 fVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_EAX;
  void *pvVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbBuffer;
  byte *pbBuffer_00;
  byte *pbBuffer_01;
  string *this;
  byte *unaff_R12;
  undefined1 auVar9 [16];
  int ec;
  TestCase *local_700;
  GrBufferIStream grstrmB;
  byte *local_6d0;
  int chwMaxGlyphID;
  void *local_6c0;
  byte *local_6b8;
  byte *local_6b0;
  byte *local_6a8;
  size_t cbGlatSzT;
  size_t cbGlatSzB;
  byte *local_690;
  byte *local_688;
  byte *local_680;
  GrBufferIStream grstrmT;
  size_t cbSillSzT;
  size_t cbFeatSzT;
  size_t cbSilfSzT;
  size_t cbSillSzB;
  size_t cbFeatSzB;
  size_t cbSilfSzB;
  void *local_628;
  byte *local_620;
  void *local_618;
  size_t cbNameSzT;
  size_t cbGlocSzT;
  size_t cbCmapSzT;
  size_t cbHeadSzT;
  size_t cbNameSzB;
  size_t cbGlocSzB;
  size_t cbCmapSzB;
  size_t cbHeadSzB;
  GrBufferIStream grstrmGlocB;
  GrBufferIStream grstrmGlatB;
  GrBufferIStream grstrmGlatT;
  GrBufferIStream grstrmGlocT;
  string local_550 [3];
  string local_4f0 [3];
  string local_490;
  string local_470;
  string local_450 [3];
  string local_3f0;
  string local_3d0;
  string local_3b0 [3];
  string local_350;
  string local_330;
  string local_310 [3];
  string local_2b0;
  string local_290;
  string local_270 [3];
  string local_210;
  string local_1f0;
  string local_1d0 [3];
  string local_170;
  string local_150;
  string local_130 [3];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ec = 0;
  local_700 = ptcase;
  fVar3 = TtfUtil::TableIdTag(ktiHead);
  pvVar6 = GrcRtFileFont::getTable(pfontBmark,fVar3,&cbHeadSzB);
  if (pvVar6 == (void *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_50,"ERROR: benchmark font has empty head table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,&local_50,-1);
    std::__cxx11::string::~string((string *)&local_50);
    pvVar6 = (void *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiHead);
    unaff_R12 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbHeadSzT);
    if (unaff_R12 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_70,"ERROR: test font has empty head table",(allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_70,-1);
      std::__cxx11::string::~string((string *)&local_70);
      unaff_R12 = (byte *)0x0;
    }
    else {
      if (cbHeadSzB != cbHeadSzT) {
        std::__cxx11::string::string
                  ((string *)&local_90,"ERROR: size of head tables do not match",
                   (allocator *)&grstrmB);
        OutputError(&ec,ptcase,&local_90,-1);
        std::__cxx11::string::~string((string *)&local_90);
      }
      iVar4 = TtfUtil::DesignUnits(pvVar6);
      iVar5 = TtfUtil::DesignUnits(unaff_R12);
      if (iVar4 != iVar5) {
        std::__cxx11::string::string
                  ((string *)&local_b0,"ERROR: design units do not match",(allocator *)&grstrmB);
        OutputError(&ec,ptcase,&local_b0,-1);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      bVar1 = TtfUtil::IsItalic(pvVar6);
      bVar2 = TtfUtil::IsItalic(unaff_R12);
      if (bVar1 != bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_d0,"ERROR: italic flags do not match",(allocator *)&grstrmB);
        OutputError(&ec,ptcase,&local_d0,-1);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
  }
  local_620 = unaff_R12;
  local_618 = pvVar6;
  fVar3 = TtfUtil::TableIdTag(ktiCmap);
  pvVar6 = GrcRtFileFont::getTable(pfontBmark,fVar3,&cbCmapSzB);
  if (pvVar6 == (void *)0x0) {
    std::__cxx11::string::string
              ((string *)local_130,"ERROR: benchmark font has empty cmap table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,local_130,-1);
    std::__cxx11::string::~string((string *)local_130);
    pvVar6 = (void *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiCmap);
    local_6c0 = GrcRtFileFont::getTable(pfontTest,fVar3,&cbCmapSzT);
    if (unaff_R12 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_150,"ERROR: test font has empty cmap table",(allocator *)&grstrmB)
      ;
      OutputError(&ec,ptcase,&local_150,-1);
      this = &local_150;
    }
    else {
      if (cbCmapSzB == cbCmapSzT) goto LAB_001027ee;
      std::__cxx11::string::string
                ((string *)&local_170,"ERROR: size of cmap tables do not match",
                 (allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_170,-1);
      this = &local_170;
    }
    std::__cxx11::string::~string((string *)this);
  }
LAB_001027ee:
  local_628 = pvVar6;
  fVar3 = TtfUtil::TableIdTag(ktiName);
  pbVar7 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbNameSzB);
  if (pbVar7 == (byte *)0x0) {
    std::__cxx11::string::string
              ((string *)local_1d0,"ERROR: benchmark font has empty name table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,local_1d0,-1);
    std::__cxx11::string::~string((string *)local_1d0);
    pbVar7 = (byte *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiName);
    unaff_R12 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbNameSzT);
    if (unaff_R12 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_1f0,"ERROR: test font has empty name table",(allocator *)&grstrmB)
      ;
      OutputError(&ec,ptcase,&local_1f0,-1);
      std::__cxx11::string::~string((string *)&local_1f0);
      unaff_R12 = (byte *)0x0;
    }
    else if (cbNameSzB != cbNameSzT) {
      std::__cxx11::string::string
                ((string *)&local_210,"ERROR: size of name tables do not match",
                 (allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_210,-1);
      std::__cxx11::string::~string((string *)&local_210);
    }
  }
  local_690 = unaff_R12;
  local_688 = pbVar7;
  fVar3 = TtfUtil::TableIdTag(ktiSilf);
  pbVar7 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbSilfSzB);
  if (pbVar7 == (byte *)0x0) {
    std::__cxx11::string::string
              ((string *)local_270,"ERROR: benchmark font has empty Silf table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,local_270,-1);
    std::__cxx11::string::~string((string *)local_270);
    pbVar7 = (byte *)0x0;
LAB_00102a58:
    pbVar8 = (byte *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiSilf);
    pbVar8 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbSilfSzT);
    if (pbVar8 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_290,"ERROR: test font has empty Silf table",(allocator *)&grstrmB)
      ;
      OutputError(&ec,ptcase,&local_290,-1);
      std::__cxx11::string::~string((string *)&local_290);
      goto LAB_00102a58;
    }
    if (CONCAT44(cbSilfSzB._4_4_,(int)cbSilfSzB) != CONCAT44(cbSilfSzT._4_4_,(int)cbSilfSzT)) {
      std::__cxx11::string::string
                ((string *)&local_2b0,"ERROR: size of Silf tables do not match",
                 (allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_2b0,-1);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
  }
  local_6a8 = pbVar8;
  local_680 = pbVar7;
  fVar3 = TtfUtil::TableIdTag(ktiFeat);
  pbVar7 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbFeatSzB);
  if (pbVar7 == (byte *)0x0) {
    std::__cxx11::string::string
              ((string *)local_310,"ERROR: benchmark font has empty Feat table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,local_310,-1);
    std::__cxx11::string::~string((string *)local_310);
    pbVar7 = (byte *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiFeat);
    pbVar8 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbFeatSzT);
    if (pbVar8 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_330,"ERROR: test font has empty Feat table",(allocator *)&grstrmB)
      ;
      OutputError(&ec,ptcase,&local_330,-1);
      std::__cxx11::string::~string((string *)&local_330);
      pbVar8 = (byte *)0x0;
    }
    else if (CONCAT44(cbFeatSzB._4_4_,(int)cbFeatSzB) != CONCAT44(cbFeatSzT._4_4_,(int)cbFeatSzT)) {
      std::__cxx11::string::string
                ((string *)&local_350,"ERROR: size of Feat tables do not match",
                 (allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_350,-1);
      std::__cxx11::string::~string((string *)&local_350);
    }
  }
  local_6b8 = pbVar8;
  local_6b0 = pbVar7;
  fVar3 = TtfUtil::TableIdTag(ktiGlat);
  pbVar7 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbGlatSzB);
  if (pbVar7 == (byte *)0x0) {
    std::__cxx11::string::string
              ((string *)local_3b0,"ERROR: benchmark font has empty Glat table",
               (allocator *)&grstrmB);
    OutputError(&ec,ptcase,local_3b0,-1);
    std::__cxx11::string::~string((string *)local_3b0);
    pbVar7 = (byte *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiGlat);
    local_6d0 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbGlatSzT);
    if (local_6d0 == (byte *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_3d0,"ERROR: test font has empty Glat table",(allocator *)&grstrmB)
      ;
      OutputError(&ec,ptcase,&local_3d0,-1);
      std::__cxx11::string::~string((string *)&local_3d0);
      local_6d0 = (byte *)0x0;
    }
    else if (CONCAT44(cbGlatSzB._4_4_,(int)cbGlatSzB) != CONCAT44(cbGlatSzT._4_4_,(int)cbGlatSzT)) {
      std::__cxx11::string::string
                ((string *)&local_3f0,"ERROR: size of Glat tables do not match",
                 (allocator *)&grstrmB);
      OutputError(&ec,ptcase,&local_3f0,-1);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
  }
  fVar3 = TtfUtil::TableIdTag(ktiGloc);
  pbVar8 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbGlocSzB);
  if (pbVar8 == (byte *)0x0) {
    std::__cxx11::string::string
              ((string *)local_450,"ERROR: benchmark font has empty Gloc table",
               (allocator *)&grstrmB);
    OutputError(&ec,local_700,local_450,-1);
    std::__cxx11::string::~string((string *)local_450);
    pbVar8 = (byte *)0x0;
  }
  else {
    fVar3 = TtfUtil::TableIdTag(ktiGloc);
    pbBuffer = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbGlocSzT);
    if (pbBuffer != (byte *)0x0) {
      if (CONCAT44(cbGlatSzB._4_4_,(int)cbGlatSzB) != CONCAT44(cbGlatSzT._4_4_,(int)cbGlatSzT)) {
        std::__cxx11::string::string
                  ((string *)&local_490,"ERROR: size of Gloc tables do not match",
                   (allocator *)&grstrmB);
        OutputError(&ec,local_700,&local_490,-1);
        std::__cxx11::string::~string((string *)&local_490);
      }
      goto LAB_00102e04;
    }
    std::__cxx11::string::string
              ((string *)&local_470,"ERROR: test font has empty Gloc table",(allocator *)&grstrmB);
    OutputError(&ec,local_700,&local_470,-1);
    std::__cxx11::string::~string((string *)&local_470);
  }
  pbBuffer = (byte *)0x0;
LAB_00102e04:
  fVar3 = TtfUtil::TableIdTag(ktiSill);
  pbBuffer_00 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar3,&cbSillSzB);
  fVar3 = TtfUtil::TableIdTag(ktiSill);
  pbBuffer_01 = (byte *)GrcRtFileFont::getTable(pfontTest,fVar3,&cbSillSzT);
  if (CONCAT44(cbSillSzB._4_4_,(int)cbSillSzB) != CONCAT44(cbSillSzT._4_4_,(int)cbSillSzT)) {
    std::__cxx11::string::string
              ((string *)local_4f0,"ERROR: size of Sill tables do not match",(allocator *)&grstrmB);
    OutputError(&ec,local_700,local_4f0,-1);
    std::__cxx11::string::~string((string *)local_4f0);
  }
  if (local_6a8 != (byte *)0x0) {
    gr::GrBufferIStream::GrBufferIStream(&grstrmB);
    gr::GrBufferIStream::GrBufferIStream(&grstrmT);
    gr::GrBufferIStream::OpenBuffer(&grstrmB,local_680,(int)cbSilfSzB);
    gr::GrBufferIStream::OpenBuffer(&grstrmT,local_6a8,(int)cbSilfSzT);
    CompareSilfTables(&ec,local_700,&grstrmB.super_GrIStream,&grstrmT.super_GrIStream,&chwMaxGlyphID
                     );
    gr::GrBufferIStream::Close(&grstrmB);
    gr::GrBufferIStream::Close(&grstrmT);
    if (chwMaxGlyphID == -1) {
      std::__cxx11::string::string
                ((string *)local_550,
                 "[Skipping Gloc and Glat tables since max glyph IDs do not match]",
                 (allocator *)&grstrmGlocB);
      OutputError((int *)&grstrmGlatB,local_700,local_550,-1);
      std::__cxx11::string::~string((string *)local_550);
    }
    else {
      auVar9._0_4_ = -(uint)((int)((ulong)pbVar7 >> 0x20) == 0 && (int)pbVar7 == 0);
      auVar9._4_4_ = -(uint)((int)pbVar8 == 0 && (int)((ulong)pbVar8 >> 0x20) == 0);
      auVar9._8_4_ = -(uint)((int)((ulong)local_6d0 >> 0x20) == 0 && (int)local_6d0 == 0);
      auVar9._12_4_ = -(uint)((int)pbBuffer == 0 && (int)((ulong)pbBuffer >> 0x20) == 0);
      iVar4 = movmskps(extraout_EAX,auVar9);
      if (iVar4 == 0) {
        gr::GrBufferIStream::GrBufferIStream(&grstrmGlatB);
        gr::GrBufferIStream::GrBufferIStream(&grstrmGlocB);
        gr::GrBufferIStream::GrBufferIStream(&grstrmGlatT);
        gr::GrBufferIStream::GrBufferIStream(&grstrmGlocT);
        gr::GrBufferIStream::OpenBuffer(&grstrmGlatB,pbVar7,(int)cbGlatSzB);
        gr::GrBufferIStream::OpenBuffer(&grstrmGlocB,pbVar8,(int)cbGlocSzB);
        gr::GrBufferIStream::OpenBuffer(&grstrmGlatT,local_6d0,(int)cbGlatSzT);
        gr::GrBufferIStream::OpenBuffer(&grstrmGlocT,pbBuffer,(int)cbGlocSzT);
        CompareGlatAndGlocTables
                  (&ec,local_700,chwMaxGlyphID,&grstrmGlatB.super_GrIStream,
                   &grstrmGlocB.super_GrIStream,&grstrmGlatT.super_GrIStream,
                   &grstrmGlocT.super_GrIStream);
        gr::GrBufferIStream::Close(&grstrmGlatB);
        gr::GrBufferIStream::Close(&grstrmGlocB);
        gr::GrBufferIStream::Close(&grstrmGlatT);
        gr::GrBufferIStream::Close(&grstrmGlocT);
        gr::GrBufferIStream::~GrBufferIStream(&grstrmGlocT);
        gr::GrBufferIStream::~GrBufferIStream(&grstrmGlatT);
        gr::GrBufferIStream::~GrBufferIStream(&grstrmGlocB);
        gr::GrBufferIStream::~GrBufferIStream(&grstrmGlatB);
      }
    }
    if (local_6b8 != (byte *)0x0 && local_6b0 != (byte *)0x0) {
      gr::GrBufferIStream::OpenBuffer(&grstrmB,local_6b0,(int)cbFeatSzB);
      gr::GrBufferIStream::OpenBuffer(&grstrmT,local_6b8,(int)cbFeatSzT);
      CompareFeatTables(&ec,local_700,&grstrmB.super_GrIStream,&grstrmT.super_GrIStream,local_688,
                        local_690);
      gr::GrBufferIStream::Close(&grstrmB);
      gr::GrBufferIStream::Close(&grstrmT);
    }
    if (pbBuffer_01 != (byte *)0x0 && pbBuffer_00 != (byte *)0x0) {
      gr::GrBufferIStream::OpenBuffer(&grstrmB,pbBuffer_00,(int)cbSillSzB);
      gr::GrBufferIStream::OpenBuffer(&grstrmT,pbBuffer_01,(int)cbSillSzT);
      CompareSillTables(&ec,local_700,&grstrmB.super_GrIStream,&grstrmT.super_GrIStream);
      gr::GrBufferIStream::Close(&grstrmB);
      gr::GrBufferIStream::Close(&grstrmT);
    }
    if (local_618 != (void *)0x0) {
      operator_delete__(local_618);
    }
    if (local_620 != (byte *)0x0) {
      operator_delete__(local_620);
    }
    if (local_628 != (void *)0x0) {
      operator_delete__(local_628);
    }
    if (local_6c0 != (void *)0x0) {
      operator_delete__(local_6c0);
    }
    if (local_688 != (byte *)0x0) {
      operator_delete__(local_688);
    }
    if (local_690 != (byte *)0x0) {
      operator_delete__(local_690);
    }
    if (local_680 != (byte *)0x0) {
      operator_delete__(local_680);
    }
    operator_delete__(local_6a8);
    if (local_6b0 != (byte *)0x0) {
      operator_delete__(local_6b0);
    }
    if (local_6b8 != (byte *)0x0) {
      operator_delete__(local_6b8);
    }
    if (pbVar7 != (byte *)0x0) {
      operator_delete__(pbVar7);
    }
    if (local_6d0 != (byte *)0x0) {
      operator_delete__(local_6d0);
    }
    if (pbVar8 != (byte *)0x0) {
      operator_delete__(pbVar8);
    }
    if (pbBuffer != (byte *)0x0) {
      operator_delete__(pbBuffer);
    }
    if (pbBuffer_00 != (byte *)0x0) {
      operator_delete__(pbBuffer_00);
    }
    if (pbBuffer_01 != (byte *)0x0) {
      operator_delete__(pbBuffer_01);
    }
    iVar4 = ec;
    gr::GrBufferIStream::~GrBufferIStream(&grstrmT);
    gr::GrBufferIStream::~GrBufferIStream(&grstrmB);
    ec = iVar4;
  }
  return ec;
}

Assistant:

int CompareFontTables(TestCase * ptcase, GrcRtFileFont * pfontBmark, GrcRtFileFont * pfontTest)
{
	int ec = 0; // error count

	// benchmark font buffers
	const gr::byte * pHeadTblB; const gr::byte * pCmapTblB; const gr::byte * pSileTblB; const gr::byte * pSilfTblB;
	const gr::byte * pFeatTblB; const gr::byte * pGlatTblB; const gr::byte * pGlocTblB; const gr::byte * pNameTblB; const gr::byte * pSillTblB;
	size_t cbHeadSzB, cbCmapSzB, /*cbSileSzB,*/ cbSilfSzB, cbFeatSzB, cbGlatSzB, cbGlocSzB, cbNameSzB, cbSillSzB;
	// test font buffers
	const gr::byte * pHeadTblT; const gr::byte * pCmapTblT; const gr::byte * pSileTblT; const gr::byte * pSilfTblT;
	const gr::byte * pFeatTblT; const gr::byte * pGlatTblT; const gr::byte * pGlocTblT; const gr::byte * pNameTblT; const gr::byte * pSillTblT;
	size_t cbHeadSzT, cbCmapSzT, /*cbSileSzT,*/ cbSilfSzT, cbFeatSzT, cbGlatSzT, cbGlocSzT, cbNameSzT, cbSillSzT;

	// head table
	try {
		pHeadTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzB));
		if (pHeadTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty head table");
		else
		{
			try {
				pHeadTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty head table");
				else
				{
					if (cbHeadSzB != cbHeadSzT)
						OutputError(ec, ptcase, "ERROR: size of head tables do not match");
					if (TtfUtil::DesignUnits(pHeadTblB) != TtfUtil::DesignUnits(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: design units do not match");
					if (TtfUtil::IsItalic(pHeadTblB) != TtfUtil::IsItalic(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: italic flags do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR, could not read test font head table");
				pHeadTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font head table");
		pHeadTblB = NULL;
		pHeadTblT = NULL;
	}

	// TODO: handle Sile table.
	pSileTblB = NULL;
	pSileTblT = NULL;

	// cmap

	try {
		pCmapTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzB));
		if (pCmapTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty cmap table");
		else
		{
			try {
				pCmapTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty cmap table");
				else
				{
					if (cbCmapSzB != cbCmapSzT)
						OutputError(ec, ptcase, "ERROR: size of cmap tables do not match");
					// TBD: do we need to test the contents of the cmap?
					// The Graphite compiler shouldn't be changing it.
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font cmap table");
				pCmapTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font cmap table");
		pCmapTblB = NULL;
		pCmapTblT = NULL;
	}

	// name

	// Currently the only stuff we're getting from the name table are our feature names,
	// so use the version from the Graphite font (not the base font if any).
	//////if (m_fUseSepBase)
	//////	pgg->SetupGraphics(&chrpOriginal);

	// name - need feature names later
	try {
        pNameTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzB));
		if (pNameTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty name table");
		else
		{
			try {
				pNameTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzT));
				if (pNameTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty name table");
				else
				{
					if (cbNameSzB != cbNameSzT)
						OutputError(ec, ptcase, "ERROR: size of name tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font name table");
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font name table");
	}

	/****
	Obtain font name from InitNew() now instead of reading from font file. InitNew should
	should have a correct font name passed to it since it should come from a font registered
	by GrFontInst.exe. This commented code could be use to verify name in font file matches.
	NOTE: if we ever use this code again, make sure we're using the base font name table,
	not the Graphite wrapper font name table.
	// find the font family name
	if (!TtfUtil::Get31EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
	{	// use Name table which is Symbol encode instead
		// this could cause problems if a real Symbol writing system is used in the name table
		// however normally real Unicode values are used instead a Symbol writing system
		if (!TtfUtil::Get30EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
		{
			ReturnResult(kresFail);
		}
		// test for Symbol writing system. first byte of Unicode id should be 0xF0
		if (vbName[lnNameOff + 1] == (unsigned char)0xF0) // 1 - Unicode id is big endian
			ReturnResult(kresFail);
	}
	if (!TtfUtil::SwapWString(vbName.Begin() + lnNameOff, lnNameSz / sizeof(utf16)))
		ReturnResult(kresFail);

	m_stuFaceName = std::wstring((utf16 *)(vbName.begin() + lnNameOff), lnNameSz / sizeof(utf16));
	****/

	// Silf
	try {
		pSilfTblT = NULL;
		if ((pSilfTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Silf table");
		else
		{
			try {
				if ((pSilfTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Silf table");
				else
				{
					if (cbSilfSzB != cbSilfSzT)
						OutputError(ec, ptcase, "ERROR: size of Silf tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Silf table");
				pSilfTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Silf table");
		pSilfTblB = NULL;
		pSilfTblT = NULL;
	}

	// Feat
	try {
		if ((pFeatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Feat table");
		else
		{
			try {
				if ((pFeatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Feat table");
				else
				{
					if (cbFeatSzB != cbFeatSzT)
						OutputError(ec, ptcase, "ERROR: size of Feat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Feat table");
				pFeatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Feat table");
		pFeatTblB = NULL;
		pFeatTblT = NULL;
	}


	// Glat
	try {
		if ((pGlatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Glat table");
		else
		{
			try {
				if ((pGlatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Glat table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Glat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Glat table");
				pGlocTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Glat table");
		pGlocTblB = NULL;
		pGlocTblT = NULL;
	}

	// Gloc
	try {
		if ((pGlocTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Gloc table");
		else
		{
			try {
				if ((pGlocTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Gloc table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Gloc tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Gloc table");
				pGlatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Gloc table");
		pGlatTblB = NULL;
		pGlatTblT = NULL;
	}

	// Sill
	try {
		pSillTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzB));
		try {
			pSillTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzT));
			if (cbSillSzB != cbSillSzT)
				OutputError(ec, ptcase, "ERROR: size of Sill tables do not match");
		}
		catch (...)
		{
			OutputError(ec, ptcase, "ERROR: in attempting to read test font Sill table");
			pSillTblT = NULL;
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: in attempting to read benchmark font Sill table");
		pSillTblB = NULL;
		pSillTblT = NULL;
	}

	if (pSilfTblT == NULL)
		return ec;
	Assert(pSilfTblB);

	GrBufferIStream grstrmB, grstrmT;
	grstrmB.OpenBuffer((gr::byte *)pSilfTblB, cbSilfSzB);
	grstrmT.OpenBuffer((gr::byte *)pSilfTblT, cbSilfSzT);
	int chwMaxGlyphID;
	CompareSilfTables(ec, ptcase, grstrmB, grstrmT, &chwMaxGlyphID);
	grstrmB.Close();
	grstrmT.Close();

	if (chwMaxGlyphID == -1)
	{
		int ecBogus;
		OutputError(ecBogus, ptcase, "[Skipping Gloc and Glat tables since max glyph IDs do not match]");
	}
	else if (pGlatTblB && pGlocTblB && pGlatTblT && pGlocTblT)
	{
		GrBufferIStream grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT;
		grstrmGlatB.OpenBuffer((gr::byte *)pGlatTblB, cbGlatSzB);
		grstrmGlocB.OpenBuffer((gr::byte *)pGlocTblB, cbGlocSzB);
		grstrmGlatT.OpenBuffer((gr::byte *)pGlatTblT, cbGlatSzT);
		grstrmGlocT.OpenBuffer((gr::byte *)pGlocTblT, cbGlocSzT);
		CompareGlatAndGlocTables(ec, ptcase, chwMaxGlyphID, grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT);
		grstrmGlatB.Close();
		grstrmGlocB.Close();
		grstrmGlatT.Close();
		grstrmGlocT.Close();
	}

	if (pFeatTblB && pFeatTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pFeatTblB, cbFeatSzB);
		grstrmT.OpenBuffer((gr::byte *)pFeatTblT, cbFeatSzT);
		CompareFeatTables(ec, ptcase, grstrmB, grstrmT, (gr::byte*)pNameTblB, (gr::byte*)pNameTblT);
		grstrmB.Close();
		grstrmT.Close();
	}

	if (pSillTblB && pSillTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pSillTblB, cbSillSzB);
		grstrmT.OpenBuffer((gr::byte *)pSillTblT, cbSillSzT);
		CompareSillTables(ec, ptcase, grstrmB, grstrmT);
		grstrmB.Close();
		grstrmT.Close();
	}

	delete[] pHeadTblB;
	delete[] pHeadTblT;

	delete[] pCmapTblB;
	delete[] pCmapTblT;

	delete[] pNameTblB;
	delete[] pNameTblT;

	delete[] pSilfTblB;
	delete[] pSilfTblT;

	delete[] pFeatTblB;
	delete[] pFeatTblT;

	delete[] pGlatTblB;
	delete[] pGlatTblT;

	delete[] pGlocTblB;
	delete[] pGlocTblT;

	delete[] pSillTblB;
	delete[] pSillTblT;

	return ec;
}